

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::ProcessorInstance::~ProcessorInstance(ProcessorInstance *this)

{
  ~ProcessorInstance(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

ProcessorInstance (CodeLocation l) : Object (std::move (l)) {}